

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_2_expr.h
# Opt level: O2

bool __thiscall
mp::
Constraints2Expr<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
::HasExpressionArgs(Constraints2Expr<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                    *this,QuadTerms *qt)

{
  int v;
  long lVar1;
  bool bVar2;
  long lVar3;
  _Invoker_type *this_00;
  ptr ppVar4;
  _Vector_base<std::pair<std::pair<int,_int>,_double>,_std::allocator<std::pair<std::pair<int,_int>,_double>_>_>
  local_48;
  ptr local_30;
  size_ty local_28;
  
  ppVar4 = (qt->folded_).
           super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.
           m_data.
           super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>.
           m_data_ptr;
  local_28 = (qt->folded_).
             super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.
             m_data.
             super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>.
             m_size;
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = &this[-8].MarkVarIfLogical_._M_invoker;
  lVar1 = local_28 << 4;
  local_30 = ppVar4;
  do {
    lVar3 = lVar1;
    if (lVar3 == 0) break;
    v = (ppVar4->first).second;
    bVar2 = FlatModel<mp::DefaultFlatModelParams>::IsProperVar
                      ((FlatModel<mp::DefaultFlatModelParams> *)this_00,(ppVar4->first).first);
    if (!bVar2) break;
    bVar2 = FlatModel<mp::DefaultFlatModelParams>::IsProperVar
                      ((FlatModel<mp::DefaultFlatModelParams> *)this_00,v);
    ppVar4 = ppVar4 + 1;
    lVar1 = lVar3 + -0x10;
  } while (bVar2);
  std::
  _Vector_base<std::pair<std::pair<int,_int>,_double>,_std::allocator<std::pair<std::pair<int,_int>,_double>_>_>
  ::~_Vector_base(&local_48);
  return lVar3 != 0;
}

Assistant:

bool HasExpressionArgs(const QuadTerms& qt) const {
    for (auto v: qt.get_folded())
      if (!MPCD( IsProperVar(v.first.first) )
          || !MPCD( IsProperVar(v.first.second) ))
        return true;
    return false;
  }